

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall duckdb::SingleFileBlockManager::Truncate(SingleFileBlockManager *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pointer this_00;
  unsigned_long uVar6;
  idx_t iVar7;
  long lVar8;
  long lVar9;
  const_iterator cVar10;
  
  BlockManager::Truncate(&this->super_BlockManager);
  p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var1 != (_Rb_tree_header *)p_Var2) {
    lVar8 = this->max_block;
    lVar9 = 0;
    p_Var4 = &p_Var1->_M_header;
    do {
      lVar3 = ::std::_Rb_tree_decrement(p_Var4);
      if (*(long *)(lVar3 + 0x20) + 1 != lVar8) break;
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + -1;
      this->max_block = lVar8;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_decrement(p_Var4);
    } while (p_Var4 != p_Var2);
    if (lVar9 != 0) {
      p_Var5 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      cVar10._M_node = &p_Var1->_M_header;
      if (p_Var5 != (_Base_ptr)0x0) {
        do {
          if (this->max_block <= *(long *)(p_Var5 + 1)) {
            cVar10._M_node = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < this->max_block];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_erase_aux(&(this->free_list)._M_t,cVar10,(const_iterator)p_Var1);
      p_Var5 = (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header;
      cVar10._M_node = &p_Var1->_M_header;
      if (p_Var5 != (_Base_ptr)0x0) {
        do {
          if (this->max_block <= *(long *)(p_Var5 + 1)) {
            cVar10._M_node = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < this->max_block];
        } while (p_Var5 != (_Base_ptr)0x0);
      }
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_erase_aux(&(this->newly_freed_list)._M_t,cVar10,(const_iterator)p_Var1);
      this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                operator->(&this->handle);
      uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
      iVar7 = optional_idx::GetIndex(&(this->super_BlockManager).block_alloc_size);
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar6 * iVar7 + 0x3000);
      FileHandle::Truncate(this_00,lVar8);
      return;
    }
  }
  return;
}

Assistant:

void SingleFileBlockManager::Truncate() {
	BlockManager::Truncate();
	idx_t blocks_to_truncate = 0;
	// reverse iterate over the free-list
	for (auto entry = free_list.rbegin(); entry != free_list.rend(); entry++) {
		auto block_id = *entry;
		if (block_id + 1 != max_block) {
			break;
		}
		blocks_to_truncate++;
		max_block--;
	}
	if (blocks_to_truncate == 0) {
		// nothing to truncate
		return;
	}
	// truncate the file
	free_list.erase(free_list.lower_bound(max_block), free_list.end());
	newly_freed_list.erase(newly_freed_list.lower_bound(max_block), newly_freed_list.end());
	handle->Truncate(NumericCast<int64_t>(BLOCK_START + NumericCast<idx_t>(max_block) * GetBlockAllocSize()));
}